

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O0

char * __thiscall kj::StringTree::flattenTo(StringTree *this,char *target,char *limit)

{
  anon_class_16_2_77190bd5 local_30;
  char *local_20;
  char *limit_local;
  char *target_local;
  StringTree *this_local;
  
  local_30.target = &limit_local;
  local_30.limit = limit;
  local_20 = limit;
  limit_local = target;
  target_local = (char *)this;
  visit<kj::StringTree::flattenTo(char*,char*)const::__0>(this,&local_30);
  return limit_local;
}

Assistant:

char* StringTree::flattenTo(char* __restrict__ target, char* limit) const {
  visit([&target,limit](ArrayPtr<const char> text) {
    size_t size = kj::min(text.size(), limit - target);
    memcpy(target, text.begin(), size);
    target += size;
  });
  return target;
}